

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

word Exp_Truth6Lit(int nVars,int Lit,word *puFanins,word *puNodes)

{
  int iVar1;
  undefined1 *puVar2;
  
  if (Lit == -1) {
    return 0;
  }
  if (Lit == -2) {
    return 0xffffffffffffffff;
  }
  iVar1 = Lit >> 1;
  if (Lit < nVars * 2) {
    if ((Lit & 1U) != 0) {
      iVar1 = Lit / 2;
      puVar2 = Exp_Truth6_Truth6;
LAB_006edbdf:
      return ~*(ulong *)((long)puVar2 + (long)iVar1 * 8);
    }
    puVar2 = Exp_Truth6_Truth6;
  }
  else {
    if ((Lit & 1U) != 0) {
      iVar1 = Lit / 2 - nVars;
      puVar2 = (undefined1 *)puFanins;
      goto LAB_006edbdf;
    }
    iVar1 = iVar1 - nVars;
    puVar2 = (undefined1 *)puFanins;
  }
  return *(word *)((long)puVar2 + (long)iVar1 * 8);
}

Assistant:

static inline word Exp_Truth6Lit( int nVars, int Lit, word * puFanins, word * puNodes )
{
    if ( Lit == EXP_CONST0 )
        return 0;
    if ( Lit == EXP_CONST1 )
        return ~(word)0;
    if ( Lit < 2 * nVars )
        return  (Lit&1) ? ~puFanins[Lit/2] : puFanins[Lit/2];
    return (Lit&1) ? ~puNodes[Lit/2-nVars] : puNodes[Lit/2-nVars];
}